

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O0

void libyuv::ScaleUVBilinearDown
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_uv,uint8_t *dst_uv,int x,int dx,int y,int dy,
               FilterMode filtering)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  void *__ptr;
  ulong uVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int yf;
  uint8_t *src;
  int yi;
  int max_y;
  uint8_t *row;
  uint8_t *row_mem;
  int clip_src_width;
  int64_t xr;
  int64_t xl;
  int64_t xlast;
  _func_void_uint8_t_ptr_uint8_t_ptr_int_int_int *ScaleUVFilterCols;
  _func_void_uint8_t_ptr_uint8_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  int j;
  int test_flag;
  code *local_80;
  ulong local_48;
  code *local_28;
  int local_1c;
  
  local_28 = InterpolateRow_C;
  if (in_EDI < 0x8000) {
    local_80 = ScaleUVFilterCols_C;
  }
  else {
    local_80 = ScaleUVFilterCols64_C;
  }
  lVar5 = (long)in_stack_00000018 + (long)(in_EDX + -1) * (long)in_stack_00000020;
  if (in_stack_00000020 < 0) {
    lVar6 = (long)in_stack_00000018;
  }
  else {
    lVar6 = lVar5;
    lVar5 = (long)in_stack_00000018;
  }
  uVar7 = lVar5 >> 0x10 & 0xfffffffffffffffc;
  local_48 = (lVar6 >> 0x10) + 5U & 0xfffffffffffffffc;
  if ((long)in_EDI < (long)local_48) {
    local_48 = (ulong)in_EDI;
  }
  iVar1 = (int)local_48 - (int)uVar7;
  uVar2 = iVar1 * 2;
  iVar3 = in_stack_00000018 - (int)(uVar7 << 0x10);
  test_flag = (int)((ulong)lVar6 >> 0x20);
  iVar4 = TestCpuFlag(test_flag);
  if ((iVar4 != 0) && (local_28 = InterpolateRow_Any_SSSE3, (uVar2 & 0xf) == 0)) {
    local_28 = InterpolateRow_SSSE3;
  }
  iVar4 = TestCpuFlag(test_flag);
  if ((iVar4 != 0) && (local_28 = InterpolateRow_Any_AVX2, (uVar2 & 0x1f) == 0)) {
    local_28 = InterpolateRow_AVX2;
  }
  __ptr = malloc((long)(iVar1 * 4 + 0x3f));
  uVar8 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
  iVar1 = (in_ESI + -1) * 0x10000;
  if (iVar1 < (int)src) {
    src._0_4_ = iVar1;
  }
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    lVar5 = uVar7 * 2 + in_stack_00000008 + (long)(((int)src >> 0x10) * in_R8D);
    if ((int)row == 1) {
      (*local_80)(in_stack_00000010,lVar5,in_EDX,iVar3,in_stack_00000020);
    }
    else {
      (*local_28)(uVar8,lVar5,(long)in_R8D,uVar2,(int)src >> 8 & 0xff);
      (*local_80)(in_stack_00000010,uVar8,in_EDX,iVar3,in_stack_00000020);
    }
    in_stack_00000010 = in_stack_00000010 + in_R9D;
    src._0_4_ = yi + (int)src;
    if (iVar1 < (int)src) {
      src._0_4_ = iVar1;
    }
  }
  free(__ptr);
  return;
}

Assistant:

static void ScaleUVBilinearDown(int src_width,
                                int src_height,
                                int dst_width,
                                int dst_height,
                                int src_stride,
                                int dst_stride,
                                const uint8_t* src_uv,
                                uint8_t* dst_uv,
                                int x,
                                int dx,
                                int y,
                                int dy,
                                enum FilterMode filtering) {
  int j;
  void (*InterpolateRow)(uint8_t * dst_uv, const uint8_t* src_uv,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  void (*ScaleUVFilterCols)(uint8_t * dst_uv, const uint8_t* src_uv,
                            int dst_width, int x, int dx) =
      (src_width >= 32768) ? ScaleUVFilterCols64_C : ScaleUVFilterCols_C;
  int64_t xlast = x + (int64_t)(dst_width - 1) * dx;
  int64_t xl = (dx >= 0) ? x : xlast;
  int64_t xr = (dx >= 0) ? xlast : x;
  int clip_src_width;
  xl = (xl >> 16) & ~3;    // Left edge aligned.
  xr = (xr >> 16) + 1;     // Right most pixel used.  Bilinear uses 2 pixels.
  xr = (xr + 1 + 3) & ~3;  // 1 beyond 4 pixel aligned right most pixel.
  if (xr > src_width) {
    xr = src_width;
  }
  clip_src_width = (int)(xr - xl) * 2;  // Width aligned to 2.
  src_uv += xl * 2;
  x -= (int)(xl << 16);
#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(clip_src_width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(clip_src_width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(clip_src_width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(clip_src_width, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif
#if defined(HAS_SCALEUVFILTERCOLS_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleUVFilterCols = ScaleUVFilterCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEUVFILTERCOLS_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ScaleUVFilterCols = ScaleUVFilterCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 4)) {
      ScaleUVFilterCols = ScaleUVFilterCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEUVFILTERCOLS_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ScaleUVFilterCols = ScaleUVFilterCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVFilterCols = ScaleUVFilterCols_MSA;
    }
  }
#endif
  // TODO(fbarchard): Consider not allocating row buffer for kFilterLinear.
  // Allocate a row of UV.
  {
    align_buffer_64(row, clip_src_width * 2);

    const int max_y = (src_height - 1) << 16;
    if (y > max_y) {
      y = max_y;
    }
    for (j = 0; j < dst_height; ++j) {
      int yi = y >> 16;
      const uint8_t* src = src_uv + yi * src_stride;
      if (filtering == kFilterLinear) {
        ScaleUVFilterCols(dst_uv, src, dst_width, x, dx);
      } else {
        int yf = (y >> 8) & 255;
        InterpolateRow(row, src, src_stride, clip_src_width, yf);
        ScaleUVFilterCols(dst_uv, row, dst_width, x, dx);
      }
      dst_uv += dst_stride;
      y += dy;
      if (y > max_y) {
        y = max_y;
      }
    }
    free_aligned_buffer_64(row);
  }
}